

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionEntryPointInfo::Invalidate(FunctionEntryPointInfo *this,bool prolongEntryPoint)

{
  FunctionProxy *this_00;
  RecyclerWeakReference<Js::ScriptFunctionType> *pRVar1;
  ScriptFunctionType *pSVar2;
  code *pcVar3;
  undefined4 uVar4;
  bool bVar5;
  undefined4 *puVar6;
  FunctionBody *this_01;
  FunctionEntryPointInfo *pFVar7;
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar8;
  undefined7 in_register_00000031;
  int i;
  long lVar9;
  undefined1 local_50 [8];
  FunctionEntryPointInfo *entryPoint;
  AutoCleanup local_40;
  AutoCleanup autoCleanup;
  
  bVar5 = FunctionProxy::IsDeferred((this->functionProxy).ptr);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2431,"(!this->functionProxy->IsDeferred())",
                                "!this->functionProxy->IsDeferred()");
    if (!bVar5) goto LAB_006d8d78;
    *puVar6 = 0;
  }
  this_01 = FunctionProxy::GetFunctionBody((this->functionProxy).ptr);
  pFVar7 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)6,Js::FunctionEntryPointInfo*>
                     ((FunctionProxy *)this_01);
  if (pFVar7 == this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x2433,"(this != functionBody->GetSimpleJitEntryPointInfo())",
                                "this != functionBody->GetSimpleJitEntryPointInfo()");
    if (!bVar5) {
LAB_006d8d78:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  EntryPointInfo::FreeJitTransferData(&this->super_EntryPointInfo);
  local_50 = (undefined1  [8])FunctionBody::GetDefaultFunctionEntryPointInfo(this_01);
  bVar5 = EntryPointInfo::IsCodeGenPending((EntryPointInfo *)local_50);
  entryPoint._4_4_ = (undefined4)CONCAT71(in_register_00000031,prolongEntryPoint);
  if (bVar5) {
    Output::Trace(LazyBailoutPhase,L"Skipping creating new entrypoint as one is already pending\n");
  }
  else {
    local_40.entryPointInfo = &this->super_EntryPointInfo;
    local_50 = (undefined1  [8])FunctionBody::CreateNewDefaultEntryPoint(this_01);
    GenerateFunction(((this_01->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     nativeCodeGen,this_01,(ScriptFunction *)0x0);
    local_40.entryPointInfo = (EntryPointInfo *)0x0;
    Invalidate::AutoCleanup::~AutoCleanup(&stack0xffffffffffffffc0);
  }
  this_00 = (this->functionProxy).ptr;
  autoCleanup.entryPointInfo = (EntryPointInfo *)local_50;
  local_40.entryPointInfo = &this->super_EntryPointInfo;
  pLVar8 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)7,JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>*>
                     (this_00);
  if (pLVar8 != (List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
                 *)0x0) {
    for (lVar9 = 0;
        lVar9 < (pLVar8->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                ).count; lVar9 = lVar9 + 1) {
      pRVar1 = (pLVar8->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar9].ptr;
      if ((((ulong)pRVar1 & 1) == 0 &&
           pRVar1 != (RecyclerWeakReference<Js::ScriptFunctionType> *)0x0) &&
         (pSVar2 = (ScriptFunctionType *)(pRVar1->super_RecyclerWeakReferenceBase).strongRef,
         pSVar2 != (ScriptFunctionType *)0x0)) {
        Invalidate::anon_class_16_2_0db8c0b9::operator()
                  ((anon_class_16_2_0db8c0b9 *)&stack0xffffffffffffffc0,pSVar2);
      }
    }
  }
  pSVar2 = (this_00->deferredPrototypeType).ptr;
  if (pSVar2 != (ScriptFunctionType *)0x0) {
    Invalidate::anon_class_16_2_0db8c0b9::operator()
              ((anon_class_16_2_0db8c0b9 *)&stack0xffffffffffffffc0,pSVar2);
  }
  uVar4 = entryPoint._4_4_;
  pSVar2 = (this_00->undeferredFunctionType).ptr;
  if (pSVar2 != (ScriptFunctionType *)0x0) {
    Invalidate::anon_class_16_2_0db8c0b9::operator()
              ((anon_class_16_2_0db8c0b9 *)&stack0xffffffffffffffc0,pSVar2);
  }
  if ((char)uVar4 == '\0') {
    ThreadContext::QueueFreeOldEntryPointInfoIfInScript
              (((this->functionProxy).ptr)->m_scriptContext->threadContext,this);
  }
  return;
}

Assistant:

void FunctionEntryPointInfo::Invalidate(bool prolongEntryPoint)
    {
        Assert(!this->functionProxy->IsDeferred());
        FunctionBody* functionBody = this->functionProxy->GetFunctionBody();
        Assert(this != functionBody->GetSimpleJitEntryPointInfo());

        // We may have got here following OOM in ProcessJitTransferData. Free any data we have
        // to reduce the chance of another OOM below.
        this->FreeJitTransferData();

        FunctionEntryPointInfo* entryPoint = functionBody->GetDefaultFunctionEntryPointInfo();
        if (entryPoint->IsCodeGenPending())
        {
            OUTPUT_TRACE(Js::LazyBailoutPhase, _u("Skipping creating new entrypoint as one is already pending\n"));
        }
        else
        {
            class AutoCleanup
            {
                EntryPointInfo *entryPointInfo;
            public:
                AutoCleanup(EntryPointInfo *entryPointInfo) : entryPointInfo(entryPointInfo)
                {
                }

                void Done()
                {
                    entryPointInfo = nullptr;
                }
                ~AutoCleanup()
                {
                    if (entryPointInfo)
                    {
                        entryPointInfo->ResetOnLazyBailoutFailure();
                    }
                }
            } autoCleanup(this);

            entryPoint = functionBody->CreateNewDefaultEntryPoint();

            GenerateFunction(functionBody->GetScriptContext()->GetNativeCodeGenerator(), functionBody, /*function*/ nullptr);
            autoCleanup.Done();

        }
        this->functionProxy->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            Assert(functionType->GetTypeId() == TypeIds_Function);

            if (functionType->GetEntryPointInfo() == this)
            {
                functionType->SetEntryPointInfo(entryPoint);
                functionType->SetEntryPoint(this->functionProxy->GetDirectEntryPoint(entryPoint));
            }
        });
        if (!prolongEntryPoint)
        {
            ThreadContext* threadContext = this->functionProxy->GetScriptContext()->GetThreadContext();
            threadContext->QueueFreeOldEntryPointInfoIfInScript(this);
        }
    }